

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O3

void __thiscall dtc::fdt::property_value::write_dts(property_value *this,FILE *file)

{
  resolve_type(this);
  switch(this->type) {
  case STRING_LIST:
  case STRING:
  case CROSS_REFERENCE:
    write_as_string(this,file);
    return;
  case BINARY:
    if ((*(int *)&(this->byte_data).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
         *(int *)&(this->byte_data).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start & 3U) != 0) {
      write_as_bytes(this,file);
      return;
    }
switchD_00120907_caseD_4:
    write_as_cells(this,file);
    return;
  case PHANDLE:
    goto switchD_00120907_caseD_4;
  default:
    __assert_fail("0 && \"Invalid type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/davidchisnall[P]dtc/fdt.cc",99,
                  "void dtc::fdt::property_value::write_dts(FILE *)");
  }
}

Assistant:

void
property_value::write_dts(FILE *file)
{
	resolve_type();
	switch (type)
	{
		default:
			assert(0 && "Invalid type");
		case STRING:
		case STRING_LIST:
		case CROSS_REFERENCE:
			write_as_string(file);
			break;
		case PHANDLE:
			write_as_cells(file);
			break;
		case BINARY:
			if (byte_data.size() % 4 == 0)
			{
				write_as_cells(file);
				break;
			}
			write_as_bytes(file);
			break;
	}
}